

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int reparse_relative_location_path(lyxp_expr *exp,uint16_t *exp_idx)

{
  uint16_t uVar1;
  int iVar2;
  char *pcVar3;
  ushort uVar4;
  lyxp_token tok;
  
  iVar2 = exp_check_token(exp,*exp_idx,LYXP_TOKEN_NONE,1);
  do {
    if (iVar2 != 0) {
      return -1;
    }
    uVar4 = *exp_idx;
    tok = exp->tokens[uVar4];
    switch(tok) {
    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
      uVar4 = uVar4 + 1;
      *exp_idx = uVar4;
      goto LAB_001624e8;
    case LYXP_TOKEN_AT:
      *exp_idx = uVar4 + 1;
      iVar2 = exp_check_token(exp,uVar4 + 1,LYXP_TOKEN_NONE,1);
      if (iVar2 != 0) {
        return -1;
      }
      uVar4 = *exp_idx;
      tok = exp->tokens[uVar4];
      if (1 < tok - LYXP_TOKEN_NAMETEST) goto switchD_001624e0_caseD_8;
      break;
    default:
switchD_001624e0_caseD_8:
      pcVar3 = print_token(tok);
      ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar3,exp->expr + exp->expr_pos[*exp_idx]);
      return -1;
    case LYXP_TOKEN_NAMETEST:
      break;
    case LYXP_TOKEN_NODETYPE:
      *exp_idx = uVar4 + 1;
      iVar2 = exp_check_token(exp,uVar4 + 1,LYXP_TOKEN_PAR1,1);
      if (iVar2 != 0) {
        return -1;
      }
      uVar1 = *exp_idx;
      *exp_idx = uVar1 + 1;
      iVar2 = exp_check_token(exp,uVar1 + 1,LYXP_TOKEN_PAR2,1);
      if (iVar2 != 0) {
        return -1;
      }
      uVar4 = *exp_idx;
    }
    *exp_idx = uVar4 + 1;
    while ((uVar4 = *exp_idx, uVar4 < exp->used && (exp->tokens[uVar4] == LYXP_TOKEN_BRACK1))) {
      iVar2 = reparse_predicate(exp,exp_idx);
      if (iVar2 != 0) {
        return -1;
      }
    }
LAB_001624e8:
    if (exp->used <= uVar4) {
      return 0;
    }
    if (exp->tokens[uVar4] != LYXP_TOKEN_OPERATOR_PATH) {
      return 0;
    }
    *exp_idx = uVar4 + 1;
    iVar2 = exp_check_token(exp,uVar4 + 1,LYXP_TOKEN_NONE,1);
  } while( true );
}

Assistant:

static int
reparse_relative_location_path(struct lyxp_expr *exp, uint16_t *exp_idx)
{
    if (exp_check_token(exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
        return -1;
    }

    goto step;
    do {
        /* '/' or '//' */
        ++(*exp_idx);

        if (exp_check_token(exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
            return -1;
        }
step:
        /* Step */
        switch (exp->tokens[*exp_idx]) {
        case LYXP_TOKEN_DOT:
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_DDOT:
            ++(*exp_idx);
            break;

        case LYXP_TOKEN_AT:
            ++(*exp_idx);

            if (exp_check_token(exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
                return -1;
            }
            if ((exp->tokens[*exp_idx] != LYXP_TOKEN_NAMETEST) && (exp->tokens[*exp_idx] != LYXP_TOKEN_NODETYPE)) {
                LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                       print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
                return -1;
            }
            /* fall through */
        case LYXP_TOKEN_NAMETEST:
            ++(*exp_idx);
            goto reparse_predicate;
            break;

        case LYXP_TOKEN_NODETYPE:
            ++(*exp_idx);

            /* '(' */
            if (exp_check_token(exp, *exp_idx, LYXP_TOKEN_PAR1, 1)) {
                return -1;
            }
            ++(*exp_idx);

            /* ')' */
            if (exp_check_token(exp, *exp_idx, LYXP_TOKEN_PAR2, 1)) {
                return -1;
            }
            ++(*exp_idx);

reparse_predicate:
            /* Predicate* */
            while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
                if (reparse_predicate(exp, exp_idx)) {
                    return -1;
                }
            }
            break;
        default:
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
                   print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
            return -1;
        }
    } while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH));

    return EXIT_SUCCESS;
}